

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O0

Input * __thiscall
helics::ValueFederateManager::getInput(ValueFederateManager *this,string_view key)

{
  string_view searchValue;
  bool bVar1;
  char *in_RDX;
  size_t in_RSI;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> inpF;
  shared_handle inpHandle;
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffff50;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> local_90;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  *in_stack_ffffffffffffff88;
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffff90;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> local_50;
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  local_38;
  size_t local_18;
  char *pcStack_10;
  Input *local_8;
  
  local_18 = in_RSI;
  pcStack_10 = in_RDX;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock_shared(in_stack_ffffffffffffff88);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::operator->(&local_38);
  searchValue._M_str = pcStack_10;
  searchValue._M_len = local_18;
  gmlc::containers::
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (in_stack_ffffffffffffff90,searchValue);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::operator->(&local_38);
  gmlc::containers::
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::end
            (in_stack_ffffffffffffff50);
  bVar1 = gmlc::containers::BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>::
          operator!=(&local_50,&local_90);
  if (bVar1) {
    local_8 = gmlc::containers::BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*>
              ::operator*(&local_50);
  }
  else {
    local_8 = (Input *)invalidIpt;
  }
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
              *)0x29ca31);
  return local_8;
}

Assistant:

const Input& ValueFederateManager::getInput(std::string_view key) const
{
    auto inpHandle = inputs.lock_shared();
    auto inpF = inpHandle->find(key);
    if (inpF != inpHandle->end()) {
        return *inpF;
    }
    return invalidIpt;
}